

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# regex.h
# Opt level: O0

void __thiscall
rapidjson::internal::GenericRegex<rapidjson::UTF8<char>,_rapidjson::CrtAllocator>::GenericRegex
          (GenericRegex<rapidjson::UTF8<char>,_rapidjson::CrtAllocator> *this,Ch *source,
          CrtAllocator *allocator)

{
  CrtAllocator *local_80;
  CrtAllocator *local_70;
  undefined1 local_60 [8];
  DecodedStream<rapidjson::GenericStringStream<rapidjson::UTF8<char>_>,_rapidjson::UTF8<char>_> ds;
  GenericStringStream<rapidjson::UTF8<char>_> ss;
  CrtAllocator *allocator_local;
  Ch *source_local;
  GenericRegex<rapidjson::UTF8<char>,_rapidjson::CrtAllocator> *this_local;
  
  if (allocator == (CrtAllocator *)0x0) {
    local_70 = (CrtAllocator *)operator_new(1);
  }
  else {
    local_70 = (CrtAllocator *)0x0;
  }
  this->ownAllocator_ = local_70;
  local_80 = allocator;
  if (allocator == (CrtAllocator *)0x0) {
    local_80 = this->ownAllocator_;
  }
  this->allocator_ = local_80;
  Stack<rapidjson::CrtAllocator>::Stack(&this->states_,this->allocator_,0x100);
  Stack<rapidjson::CrtAllocator>::Stack(&this->ranges_,this->allocator_,0x100);
  this->root_ = 0xffffffff;
  this->stateCount_ = 0;
  this->rangeCount_ = 0;
  this->anchorBegin_ = false;
  this->anchorEnd_ = false;
  GenericStringStream<rapidjson::UTF8<char>_>::GenericStringStream
            ((GenericStringStream<rapidjson::UTF8<char>_> *)&ds.codepoint_,source);
  DecodedStream<rapidjson::GenericStringStream<rapidjson::UTF8<char>_>,_rapidjson::UTF8<char>_>::
  DecodedStream((DecodedStream<rapidjson::GenericStringStream<rapidjson::UTF8<char>_>,_rapidjson::UTF8<char>_>
                 *)local_60,(GenericStringStream<rapidjson::UTF8<char>_> *)&ds.codepoint_);
  GenericRegex<rapidjson::UTF8<char>,rapidjson::CrtAllocator>::
  Parse<rapidjson::GenericStringStream<rapidjson::UTF8<char>>>
            ((GenericRegex<rapidjson::UTF8<char>,rapidjson::CrtAllocator> *)this,
             (DecodedStream<rapidjson::GenericStringStream<rapidjson::UTF8<char>_>,_rapidjson::UTF8<char>_>
              *)local_60);
  return;
}

Assistant:

GenericRegex(const Ch* source, Allocator* allocator = 0) : 
        ownAllocator_(allocator ? 0 : RAPIDJSON_NEW(Allocator)()), allocator_(allocator ? allocator : ownAllocator_), 
        states_(allocator_, 256), ranges_(allocator_, 256), root_(kRegexInvalidState), stateCount_(), rangeCount_(), 
        anchorBegin_(), anchorEnd_()
    {
        GenericStringStream<Encoding> ss(source);
        DecodedStream<GenericStringStream<Encoding>, Encoding> ds(ss);
        Parse(ds);
    }